

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestCase::hasTag(TestCase *this,string *tag)

{
  byte bVar1;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  string *in_stack_ffffffffffffffa8;
  _Self local_50 [3];
  string local_38 [32];
  _Self local_18 [3];
  
  toLower(in_stack_ffffffffffffffa8);
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),(key_type *)0x175a94)
  ;
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  bVar1 = std::operator!=(local_18,local_50);
  std::__cxx11::string::~string(local_38);
  return (bool)(bVar1 & 1);
}

Assistant:

bool TestCase::hasTag( std::string const& tag ) const {
        return tags.find( toLower( tag ) ) != tags.end();
    }